

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wint_t ** terminal_alloc_buffer(EditLine *el)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wint_t **__ptr;
  wint_t *pwVar3;
  ulong uVar4;
  bool bVar5;
  
  wVar1 = (el->el_terminal).t_size.v;
  __ptr = (wint_t **)calloc((long)wVar1 + 1,8);
  if (__ptr == (wint_t **)0x0) {
LAB_001123c4:
    __ptr = (wint_t **)0x0;
  }
  else {
    if (L'\0' < wVar1) {
      wVar2 = (el->el_terminal).t_size.h;
      uVar4 = 1;
      do {
        pwVar3 = (wint_t *)calloc((long)wVar2 + 1,4);
        __ptr[uVar4 - 1] = pwVar3;
        if (pwVar3 == (wint_t *)0x0) {
          if (uVar4 != 1) {
            do {
              free(__ptr[(int)uVar4 - 2]);
              uVar4 = uVar4 - 1;
            } while (1 < (long)uVar4);
          }
          free(__ptr);
          goto LAB_001123c4;
        }
        bVar5 = uVar4 != (uint)wVar1;
        uVar4 = uVar4 + 1;
      } while (bVar5);
    }
    __ptr[wVar1] = (wint_t *)0x0;
  }
  return __ptr;
}

Assistant:

static wint_t **
terminal_alloc_buffer(EditLine *el)
{
	wint_t **b;
	coord_t *c = &el->el_terminal.t_size;
	int i;

	b =  el_calloc((size_t)(c->v + 1), sizeof(*b));
	if (b == NULL)
		return NULL;
	for (i = 0; i < c->v; i++) {
		b[i] = el_calloc((size_t)(c->h + 1), sizeof(**b));
		if (b[i] == NULL) {
			while (--i >= 0)
				el_free(b[i]);
			el_free(b);
			return NULL;
		}
	}
	b[c->v] = NULL;
	return b;
}